

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_file_cache.c
# Opt level: O0

ngx_int_t ngx_http_file_cache_create(ngx_http_request_t *r)

{
  ngx_http_cache_t *c_00;
  ngx_http_file_cache_t *cache_00;
  ngx_pool_cleanup_t *pnVar1;
  ngx_int_t nVar2;
  ngx_http_file_cache_t *cache;
  ngx_pool_cleanup_t *cln;
  ngx_http_cache_t *c;
  ngx_http_request_t *r_local;
  
  c_00 = r->cache;
  cache_00 = c_00->file_cache;
  pnVar1 = ngx_pool_cleanup_add(r->pool,0);
  if (pnVar1 == (ngx_pool_cleanup_t *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    pnVar1->handler = ngx_http_file_cache_cleanup;
    pnVar1->data = c_00;
    nVar2 = ngx_http_file_cache_exists(cache_00,c_00);
    if (nVar2 == -1) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      nVar2 = ngx_http_file_cache_name(r,cache_00->path);
      if (nVar2 == 0) {
        r_local = (ngx_http_request_t *)0x0;
      }
      else {
        r_local = (ngx_http_request_t *)0xffffffffffffffff;
      }
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

ngx_int_t
ngx_http_file_cache_create(ngx_http_request_t *r)
{
    ngx_http_cache_t       *c;
    ngx_pool_cleanup_t     *cln;
    ngx_http_file_cache_t  *cache;

    c = r->cache;
    cache = c->file_cache;

    cln = ngx_pool_cleanup_add(r->pool, 0);
    if (cln == NULL) {
        return NGX_ERROR;
    }

    cln->handler = ngx_http_file_cache_cleanup;
    cln->data = c;

    if (ngx_http_file_cache_exists(cache, c) == NGX_ERROR) {
        return NGX_ERROR;
    }

    if (ngx_http_file_cache_name(r, cache->path) != NGX_OK) {
        return NGX_ERROR;
    }

    return NGX_OK;
}